

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharsAsStringTo<char>(char *begin,size_t len,ostream *os)

{
  bool bVar1;
  CharFormat CVar2;
  ostream *poVar3;
  ostream *in_RDX;
  ulong in_RSI;
  long in_RDI;
  char cur;
  size_t index;
  bool is_previous_hex;
  char *kQuoteBegin;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar4;
  ulong uVar5;
  
  std::operator<<(in_RDX,"\"");
  bVar1 = false;
  for (uVar5 = 0; uVar5 < in_RSI; uVar5 = uVar5 + 1) {
    uVar4 = *(undefined1 *)(in_RDI + uVar5);
    if ((bVar1) && (bVar1 = IsXDigit('\0'), bVar1)) {
      poVar3 = std::operator<<(in_RDX,"\" ");
      std::operator<<(poVar3,"\"");
    }
    CVar2 = PrintAsStringLiteralTo
                      ((char)(uVar5 >> 0x38),(ostream *)CONCAT17(uVar4,in_stack_ffffffffffffffc8));
    bVar1 = CVar2 == kHexEscape;
  }
  std::operator<<(in_RDX,"\"");
  return;
}

Assistant:

static void PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}